

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O1

uECC_word_t
EccPoint_compute_public_key(uECC_word_t *result,uECC_word_t *private_key,uECC_Curve curve)

{
  byte bVar1;
  uECC_word_t uVar2;
  ulong uVar3;
  ulong uVar4;
  uECC_word_t uVar5;
  uECC_word_t *p2 [2];
  uECC_word_t tmp2 [4];
  uECC_word_t tmp1 [4];
  uECC_word_t *local_68 [2];
  uECC_word_t local_58 [4];
  uECC_word_t local_38 [4];
  
  local_68[0] = local_38;
  local_68[1] = local_58;
  uVar2 = regularize_k(private_key,local_68[0],local_68[1],curve);
  uVar5 = 0;
  EccPoint_mult(result,curve->G,local_68[uVar2 ^ 1],(uECC_word_t *)0x0,curve->num_n_bits + 1,curve);
  bVar1 = curve->num_words * '\x02';
  if ('\0' < (char)bVar1) {
    uVar3 = 0;
    uVar4 = 0;
    do {
      uVar4 = uVar4 | result[uVar3];
      uVar3 = uVar3 + 1;
    } while (bVar1 != uVar3);
    uVar5 = (uECC_word_t)(uVar4 != 0);
  }
  return uVar5;
}

Assistant:

static uECC_word_t EccPoint_compute_public_key(uECC_word_t *result,
                                               uECC_word_t *private_key,
                                               uECC_Curve curve) {
    uECC_word_t tmp1[uECC_MAX_WORDS];
    uECC_word_t tmp2[uECC_MAX_WORDS];
    uECC_word_t *p2[2] = {tmp1, tmp2};
    uECC_word_t carry;

    /* Regularize the bitcount for the private key so that attackers cannot use a side channel
       attack to learn the number of leading zeros. */
    carry = regularize_k(private_key, tmp1, tmp2, curve);

    EccPoint_mult(result, curve->G, p2[!carry], 0, curve->num_n_bits + 1, curve);

    if (EccPoint_isZero(result, curve)) {
        return 0;
    }
    return 1;
}